

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall ritobin::io::impl_text_read::TextReader::read_bool(TextReader *this,bool *value)

{
  bool bVar1;
  int *piVar2;
  string_view sVar3;
  
  sVar3 = read_word(this);
  piVar2 = (int *)sVar3._M_str;
  if (sVar3._M_len == 5) {
    bVar1 = false;
    if ((char)piVar2[1] != 'e' || *piVar2 != 0x736c6166) {
      return false;
    }
  }
  else {
    if ((sVar3._M_len != 4) || (*piVar2 != 0x65757274)) {
      return false;
    }
    bVar1 = true;
  }
  *value = bVar1;
  return true;
}

Assistant:

bool read_bool(bool& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (word == "true") {
                value = true;
                return true;
            }
            else if (word == "false") {
                value = false;
                return true;
            }
            else {
                return false;
            }
        }